

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_roi_utils.c
# Opt level: O1

MPP_RET gen_vepu54x_roi(MppEncRoiImpl *ctx,Vepu541RoiCfg *dst)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  RK_S32 RVar6;
  int iVar7;
  MPP_RET MVar8;
  uint uVar9;
  void *pvVar10;
  int iVar11;
  ulong uVar12;
  Vepu541RoiCfg *pVVar13;
  MPP_RET MVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  RK_S32 *pRVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  RoiRegionCfg *pRVar22;
  RK_U8 *pRVar23;
  
  pRVar22 = ctx->regions;
  iVar7 = ctx->w + 0xf >> 4;
  iVar11 = ctx->h + 0xf >> 4;
  uVar19 = iVar7 + 3U & 0xfffffffc;
  pvVar10 = memset(ctx->cu_map,0,(ulong)ctx->cu_size);
  MVar14 = (iVar11 + 3U & 0x3ffffffc) * uVar19;
  MVar8 = (MPP_RET)pvVar10;
  if (MPP_OK < MVar14) {
    uVar12 = 0;
    do {
      dst[uVar12] = (Vepu541RoiCfg)0x80;
      uVar12 = uVar12 + 1;
      MVar8 = MVar14;
    } while ((uint)MVar14 != uVar12);
  }
  iVar4 = ctx->w;
  if ((iVar4 < 1) || (ctx->h < 1)) {
    MVar8 = _mpp_log_l(2,"enc_roi_utils","invalid size [%d:%d]\n","gen_vepu54x_roi",iVar4,ctx->h);
    return MVar8;
  }
  if (MPP_OK < ctx->count) {
    pRVar18 = &pRVar22->qp_val;
    MVar8 = MPP_OK;
    do {
      if ((iVar4 < (int)((uint)*(ushort *)(pRVar18 + -3) + (uint)((RoiRegionCfg *)(pRVar18 + -4))->x
                        )) ||
         (iVar21 = 0,
         ctx->h < (int)((uint)*(RK_U16 *)((long)pRVar18 + -10) +
                       (uint)*(RK_U16 *)((long)pRVar18 + -0xe)))) {
        iVar21 = -1;
      }
      if ((1 < pRVar18[-2]) || (1 < pRVar18[-1])) {
        iVar21 = -1;
      }
      if (pRVar18[-1] == 0) {
LAB_0010a555:
        if (*pRVar18 - 0x34U < 0xffffff99) {
LAB_0010a561:
          iVar21 = -1;
        }
      }
      else {
        if (0x33 < *pRVar18) goto LAB_0010a561;
        if (pRVar18[-1] == 0) goto LAB_0010a555;
      }
      if (iVar21 != 0) {
        _mpp_log_l(2,"enc_roi_utils","region %d invalid param:\n","gen_vepu54x_roi",MVar8);
        _mpp_log_l(2,"enc_roi_utils","position [%d:%d:%d:%d] vs [%d:%d]\n","gen_vepu54x_roi",
                   ((RoiRegionCfg *)(pRVar18 + -4))->x,*(RK_U16 *)((long)pRVar18 + -0xe),
                   *(RK_U16 *)(pRVar18 + -3),*(RK_U16 *)((long)pRVar18 + -10),ctx->w,ctx->h);
        MVar8 = _mpp_log_l(2,"enc_roi_utils","force intra %d qp mode %d val %d\n","gen_vepu54x_roi",
                           pRVar18[-2],pRVar18[-1],*pRVar18);
        return MVar8;
      }
      MVar8 = MVar8 + ~MPP_ERR_UNKNOW;
      pRVar18 = pRVar18 + 5;
    } while (ctx->count != MVar8);
  }
  if (0 < ctx->count) {
    pRVar22 = ctx->regions;
    uVar16 = (int)(iVar7 + 3U) >> 2;
    MVar8 = MPP_OK;
    do {
      pRVar23 = ctx->cu_map;
      uVar1 = pRVar22->w;
      uVar2 = pRVar22->h;
      uVar9 = pRVar22->x + 0xf >> 4;
      uVar3 = pRVar22->y;
      if (((((iVar7 <= (int)uVar9) &&
            (_mpp_log_l(2,"enc_roi_utils","Assertion %s failed at %s:%d\n",0,
                        "pos_x_init >= 0 && pos_x_init < mb_w","gen_vepu54x_roi",0x120),
            (DAT_001183b3 & 0x10) != 0)) ||
           ((uVar15 = uVar1 + 0xf >> 4, iVar7 < (int)(uVar9 + uVar15) &&
            (_mpp_log_l(2,"enc_roi_utils","Assertion %s failed at %s:%d\n",0,
                        "pos_x_end >= 0 && pos_x_end <= mb_w","gen_vepu54x_roi",0x121),
            (DAT_001183b3 & 0x10) != 0)))) ||
          ((uVar20 = uVar3 + 0xf >> 4, iVar11 <= (int)uVar20 &&
           (_mpp_log_l(2,"enc_roi_utils","Assertion %s failed at %s:%d\n",0,
                       "pos_y_init >= 0 && pos_y_init < mb_h","gen_vepu54x_roi",0x122),
           (DAT_001183b3 & 0x10) != 0)))) ||
         ((uVar17 = uVar2 + 0xf >> 4, iVar11 < (int)(uVar20 + uVar17) &&
          (_mpp_log_l(2,"enc_roi_utils","Assertion %s failed at %s:%d\n",0,
                      "pos_y_end >= 0 && pos_y_end <= mb_h","gen_vepu54x_roi",0x123),
          (DAT_001183b3 & 0x10) != 0)))) {
        abort();
      }
      if (uVar2 != 0) {
        RVar6 = pRVar22->force_intra;
        iVar4 = pRVar22->qp_mode;
        uVar5 = pRVar22->qp_val;
        iVar21 = uVar20 * uVar19 + uVar9;
        pRVar23 = pRVar23 + iVar21;
        pVVar13 = dst + iVar21;
        uVar9 = 0;
        do {
          if (uVar1 != 0) {
            uVar12 = 0;
            do {
              pVVar13[uVar12] =
                   (Vepu541RoiCfg)
                   ((short)(iVar4 << 0xf) + ((ushort)((uVar5 & 0x7f) << 8) | (ushort)RVar6 & 1) +
                   0x80);
              if (ctx->type == MPP_VIDEO_CodingAVC) {
                pRVar23[uVar12] = '\x01';
              }
              uVar12 = uVar12 + 1;
            } while (uVar15 != uVar12);
          }
          pRVar23 = pRVar23 + (int)uVar19;
          uVar9 = uVar9 + 1;
          pVVar13 = pVVar13 + (int)uVar19;
        } while (uVar9 != uVar17);
      }
      if (ctx->type == MPP_VIDEO_CodingHEVC) {
        uVar9 = pRVar22->w + 0x40 >> 6;
        uVar1 = pRVar22->x;
        if (uVar1 < 0x40) {
          uVar9 = uVar9 + 2;
          uVar15 = 0;
        }
        else if ((uVar1 & 0x3f) == 0) {
          uVar15 = (uint)(uVar1 >> 6);
        }
        else {
          uVar15 = uVar1 - 0x40 >> 6;
          uVar9 = uVar9 + 2;
        }
        uVar20 = pRVar22->h + 0x40 >> 6;
        uVar1 = pRVar22->y;
        if (uVar1 < 0x40) {
          uVar20 = uVar20 + 2;
          uVar17 = 0;
        }
        else if ((uVar1 & 0x3f) == 0) {
          uVar17 = (uint)(uVar1 >> 6);
        }
        else {
          uVar17 = uVar1 - 0x40 >> 6;
          uVar20 = uVar20 + 2;
        }
        pRVar23 = ctx->cu_map + (uVar16 * uVar17 + uVar15);
        do {
          memset(pRVar23,1,(ulong)uVar9);
          pRVar23 = pRVar23 + uVar16;
          uVar20 = uVar20 - 1;
        } while (uVar20 != 0);
      }
      MVar8 = MVar8 + ~MPP_ERR_UNKNOW;
      pRVar22 = pRVar22 + 1;
    } while (MVar8 < ctx->count);
  }
  return MVar8;
}

Assistant:

static MPP_RET gen_vepu54x_roi(MppEncRoiImpl *ctx, Vepu541RoiCfg *dst)
{
    RoiRegionCfg *region = ctx->regions;
    RK_S32 mb_w = MPP_ALIGN(ctx->w, 16) / 16;
    RK_S32 mb_h = MPP_ALIGN(ctx->h, 16) / 16;
    RK_S32 stride_h = MPP_ALIGN(mb_w, 4);
    RK_S32 stride_v = MPP_ALIGN(mb_h, 4);
    Vepu541RoiCfg cfg;
    MPP_RET ret = MPP_NOK;
    RK_S32 i;

    memset(ctx->cu_map, 0, ctx->cu_size);

    cfg.force_intra = 0;
    cfg.reserved    = 0;
    cfg.qp_area_idx = 0;
    cfg.qp_area_en  = 1;
    cfg.qp_adj      = 0;
    cfg.qp_adj_mode = 0;

    /* step 1. reset all the config */
    for (i = 0; i < stride_h * stride_v; i++)
        memcpy(dst + i, &cfg, sizeof(cfg));

    if (ctx->w <= 0 || ctx->h <= 0) {
        mpp_err_f("invalid size [%d:%d]\n", ctx->w, ctx->h);
        goto DONE;
    }

    /* check region config */
    ret = MPP_OK;
    for (i = 0; i < ctx->count; i++, region++) {
        if (region->x + region->w > ctx->w || region->y + region->h > ctx->h)
            ret = MPP_NOK;

        if (region->force_intra > 1 || region->qp_mode > 1)
            ret = MPP_NOK;

        if ((region->qp_mode && region->qp_val > 51) ||
            (!region->qp_mode && (region->qp_val > 51 || region->qp_val < -51)))
            ret = MPP_NOK;

        if (ret) {
            mpp_err_f("region %d invalid param:\n", i);
            mpp_err_f("position [%d:%d:%d:%d] vs [%d:%d]\n",
                      region->x, region->y, region->w, region->h, ctx->w, ctx->h);
            mpp_err_f("force intra %d qp mode %d val %d\n",
                      region->force_intra, region->qp_mode, region->qp_val);
            goto DONE;
        }
    }

    region = ctx->regions;
    /* step 2. setup region for top to bottom */
    for (i = 0; i < ctx->count; i++, region++) {
        Vepu541RoiCfg *p = dst;
        RK_U8 *map = ctx->cu_map;
        RK_S32 roi_width  = (region->w + 15) / 16;
        RK_S32 roi_height = (region->h + 15) / 16;
        RK_S32 pos_x_init = (region->x + 15) / 16;
        RK_S32 pos_y_init = (region->y + 15) / 16;
        RK_S32 pos_x_end  = pos_x_init + roi_width;
        RK_S32 pos_y_end  = pos_y_init + roi_height;
        RK_S32 x, y;

        mpp_assert(pos_x_init >= 0 && pos_x_init < mb_w);
        mpp_assert(pos_x_end  >= 0 && pos_x_end <= mb_w);
        mpp_assert(pos_y_init >= 0 && pos_y_init < mb_h);
        mpp_assert(pos_y_end  >= 0 && pos_y_end <= mb_h);

        cfg.force_intra = region->force_intra;
        cfg.reserved    = 0;
        cfg.qp_area_idx = 0;
        // NOTE: When roi is enabled the qp_area_en should be one.
        cfg.qp_area_en  = 1; // region->area_map_en;
        cfg.qp_adj      = region->qp_val;
        cfg.qp_adj_mode = region->qp_mode;

        p += pos_y_init * stride_h + pos_x_init;
        map += pos_y_init * stride_h + pos_x_init;
        for (y = 0; y < roi_height; y++) {
            for (x = 0; x < roi_width; x++) {
                memcpy(p + x, &cfg, sizeof(cfg));
                if (ctx->type == MPP_VIDEO_CodingAVC) {
                    *(map + x) = 1;
                }

            }
            p += stride_h;
            map += stride_h;
        }

        if (ctx->type == MPP_VIDEO_CodingHEVC) {
            map = ctx->cu_map;
            RK_U32 stride_cu64_h = stride_h * 16 / 64;

            roi_width  = (region->w + 64) / 64;
            roi_height = (region->h + 64) / 64;

            if (region->x < 64) {
                pos_x_init = 0;
                roi_width += 2;
            } else if (region->x % 64) {
                pos_x_init = (region->x - 64) / 64;
                roi_width += 2;
            } else
                pos_x_init = region->x / 64;

            if (region->y < 64) {
                pos_y_init = 0;
                roi_height += 2;
            } else if (region->y % 64) {
                pos_y_init = (region->y - 64) / 64;
                roi_height += 2;
            } else
                pos_y_init = region->y / 64;

            map += pos_y_init * stride_cu64_h + pos_x_init;
            for (y = 0; y < roi_height; y++) {
                for (x = 0; x < roi_width; x++) {
                    *(map + x) = 1;
                }
                map += stride_cu64_h;
            }
        }
    }

DONE:
    return ret;
}